

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_strip_synclos_bound(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp kdr;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp kar;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  int i;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp_sint_t in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp local_58;
  undefined1 local_50 [24];
  undefined8 local_38 [2];
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined8 local_8;
  
  uVar2 = &DAT_0000043e;
  memset(local_38,0,0x10);
  local_50._16_8_ = 0x43e;
  memset(local_50,0,0x10);
  local_58 = (sexp)0x43e;
  memset(&stack0xffffffffffffff98,0,0x10);
  local_8 = in_RSI;
  if (0 < (int)in_EDX) {
    local_38[0] = &stack0xffffffffffffffd8;
    local_38[1] = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined8 **)(in_RDI + 0x6080) = local_38;
    local_50._0_8_ = local_50 + 0x10;
    local_50._8_8_ = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = local_50;
    psVar1 = (sexp)&local_58;
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff98;
    local_8 = sexp_id_name((sexp)in_RSI);
    uVar3 = (undefined4)((ulong)uVar2 >> 0x20);
    if (((local_8 & 3) == 0) && (((sexp)local_8)->tag == 6)) {
      local_50._16_8_ =
           sexp_strip_synclos_bound
                     ((sexp)local_8,(sexp)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),uVar3);
      local_58 = sexp_strip_synclos_bound
                           ((sexp)local_8,(sexp)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),uVar3);
      uVar2 = local_8;
      local_8 = sexp_cons_op(psVar1,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      (((sexp)local_8)->value).type.slots = (((sexp)uVar2)->value).type.slots;
      ((sexp)local_8)->field_0x5 = ((sexp)local_8)->field_0x5 & 0xfe | 1;
    }
    else if (((local_8 & 3) == 0) && (((sexp)local_8)->tag == 10)) {
      for (uVar3 = 0; (sexp)(long)(int)uVar3 < (((sexp)local_8)->value).type.name; uVar3 = uVar3 + 1
          ) {
        psVar1 = sexp_strip_synclos_bound
                           ((sexp)local_8,(sexp)CONCAT44(in_EDX,uVar3),(int)((ulong)uVar2 >> 0x20));
        *(sexp *)((long)&((sexp)local_8)->value + (((long)(int)uVar3 << 1) / 2) * 8 + 8) = psVar1;
      }
    }
    *(undefined8 *)(in_RDI + 0x6080) = local_38[1];
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_strip_synclos_bound (sexp ctx, sexp x, int depth) {
  int i;
  sexp_gc_var3(res, kar, kdr);
  if (depth <= 0) return x;
  sexp_gc_preserve3(ctx, res, kar, kdr);
  x = sexp_id_name(x);
  if (sexp_pairp(x)) {
    kar = sexp_strip_synclos_bound(ctx, sexp_car(x), depth-1);
    kdr = sexp_strip_synclos_bound(ctx, sexp_cdr(x), depth-1);
    res = sexp_cons(ctx, kar, kdr);
    sexp_pair_source(res) = sexp_pair_source(x);
    sexp_immutablep(res) = 1;
  } else {
    if (sexp_vectorp(x))
      for (i = 0; i < sexp_vector_length(x); ++i)
        sexp_vector_set(x, sexp_make_fixnum(i), sexp_strip_synclos_bound(ctx, sexp_vector_ref(x, sexp_make_fixnum(i)), depth-1));
    res = x;
  }
  sexp_gc_release3(ctx);
  return res;
}